

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b57d1::TransformNoSelector::~TransformNoSelector(TransformNoSelector *this)

{
  TransformNoSelector *this_local;
  
  ~TransformNoSelector(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TransformNoSelector()
    : TransformSelector("NO SELECTOR")
  {
  }